

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O0

REF_STATUS ref_interp_create_search(REF_INTERP ref_interp)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  uint uVar1;
  REF_STATUS RVar2;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_SEARCH ref_search;
  REF_DBL radius;
  REF_DBL center [3];
  REF_INT local_a8 [2];
  REF_INT nodes [27];
  REF_INT cell;
  REF_CELL from_tri;
  REF_CELL from_tet;
  REF_NODE from_node;
  REF_GRID from_grid;
  REF_INTERP ref_interp_local;
  
  ref_node = ref_interp->from_grid->node;
  ref_cell = ref_interp->from_tet;
  unique0x00012000 = ref_interp->from_tri;
  if (ref_interp->from_grid->twod == 0) {
    uVar1 = ref_search_create((REF_SEARCH *)&ref_private_macro_code_rss_1,ref_cell->n);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x85
             ,"ref_interp_create_search",(ulong)uVar1,"create search");
      return uVar1;
    }
    for (nodes[0x19] = 0; nodes[0x19] < ref_cell->max; nodes[0x19] = nodes[0x19] + 1) {
      RVar2 = ref_cell_nodes(ref_cell,nodes[0x19],local_a8);
      if (RVar2 == 0) {
        uVar1 = ref_node_bounding_sphere(ref_node,local_a8,4,&radius,(REF_DBL *)&ref_search);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x87,"ref_interp_create_search",(ulong)uVar1,"b");
          return uVar1;
        }
        uVar1 = ref_search_insert(_ref_private_macro_code_rss_1,nodes[0x19],&radius,
                                  ref_interp->search_donor_scale * (double)ref_search);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x8a,"ref_interp_create_search",(ulong)uVar1,"ins");
          return uVar1;
        }
      }
    }
  }
  else {
    uVar1 = ref_search_create((REF_SEARCH *)&ref_private_macro_code_rss_1,unique0x00012000->n);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x7d
             ,"ref_interp_create_search",(ulong)uVar1,"create search");
      return uVar1;
    }
    for (nodes[0x19] = 0; nodes[0x19] < stack0xffffffffffffffc8->max; nodes[0x19] = nodes[0x19] + 1)
    {
      RVar2 = ref_cell_nodes(stack0xffffffffffffffc8,nodes[0x19],local_a8);
      if (RVar2 == 0) {
        uVar1 = ref_node_bounding_sphere(ref_node,local_a8,3,&radius,(REF_DBL *)&ref_search);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x7f,"ref_interp_create_search",(ulong)uVar1,"b");
          return uVar1;
        }
        uVar1 = ref_search_insert(_ref_private_macro_code_rss_1,nodes[0x19],&radius,
                                  ref_interp->search_donor_scale * (double)ref_search);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x82,"ref_interp_create_search",(ulong)uVar1,"ins");
          return uVar1;
        }
      }
    }
  }
  ref_interp->ref_search = _ref_private_macro_code_rss_1;
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_interp_create_search(REF_INTERP ref_interp) {
  REF_GRID from_grid = ref_interp_from_grid(ref_interp);
  REF_NODE from_node = ref_grid_node(from_grid);
  REF_CELL from_tet = ref_interp_from_tet(ref_interp);
  REF_CELL from_tri = ref_interp_from_tri(ref_interp);
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL center[3], radius;
  REF_SEARCH ref_search;

  if (ref_grid_twod(from_grid)) {
    RSS(ref_search_create(&ref_search, ref_cell_n(from_tri)), "create search");
    each_ref_cell_valid_cell_with_nodes(from_tri, cell, nodes) {
      RSS(ref_node_bounding_sphere(from_node, nodes, 3, center, &radius), "b");
      RSS(ref_search_insert(ref_search, cell, center,
                            ref_interp_search_donor_scale(ref_interp) * radius),
          "ins");
    }
  } else {
    RSS(ref_search_create(&ref_search, ref_cell_n(from_tet)), "create search");
    each_ref_cell_valid_cell_with_nodes(from_tet, cell, nodes) {
      RSS(ref_node_bounding_sphere(from_node, nodes, 4, center, &radius), "b");
      RSS(ref_search_insert(ref_search, cell, center,
                            ref_interp_search_donor_scale(ref_interp) * radius),
          "ins");
    }
  }
  ref_interp_search(ref_interp) = ref_search;

  return REF_SUCCESS;
}